

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

void Gia_ManCollectSeqTest(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  abctime aVar1;
  abctime time;
  uint *in_RSI;
  uint uVar2;
  int iVar3;
  uint local_3c;
  abctime local_38;
  
  local_38 = Abc_Clock();
  iVar3 = 0;
  uVar2 = 0;
  while( true ) {
    local_3c = uVar2;
    if (p->vCos->nSize - p->nRegs <= (int)uVar2) break;
    if ((uVar2 / 10000) * 10000 + iVar3 == 0) {
      printf("%8d finished...\r",(ulong)uVar2,(ulong)uVar2 % 10000);
    }
    in_RSI = &local_3c;
    p_00 = Gia_ManCollectSeq(p,(int *)&local_3c,1);
    Vec_IntFree(p_00);
    uVar2 = uVar2 + 1;
    iVar3 = iVar3 + -1;
  }
  aVar1 = Abc_Clock();
  Abc_PrintTime((int)aVar1 - (int)local_38,(char *)in_RSI,time);
  return;
}

Assistant:

void Gia_ManCollectSeqTest( Gia_Man_t * p )
{
    Vec_Int_t * vObjs;
    int i;
    abctime clk = Abc_Clock();
    for ( i = 0; i < Gia_ManPoNum(p); i++ )
    {
        if ( i % 10000 == 0 )
            printf( "%8d finished...\r", i );

        vObjs = Gia_ManCollectSeq( p, &i, 1 );
//        printf( "%d ", Vec_IntSize(vObjs) );
        Vec_IntFree( vObjs );
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

}